

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void compare_numbers<unsigned_int,unsigned_int>(char *description,uint *expected,uint *actual)

{
  ostream *poVar1;
  
  if (*expected == *actual) {
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,description);
  poVar1 = std::operator<<(poVar1,": expected = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"; actual = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void
compare_numbers(char const* description, T1 const& expected, T2 const& actual)
{
    if (expected != actual) {
        std::cerr << description << ": expected = " << expected << "; actual = " << actual
                  << std::endl;
    }
}